

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

bool lsim::serialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  undefined1 local_100 [8];
  Serializer serializer;
  char *filename_local;
  ModelCircuitLibrary *lib_local;
  LSimContext *context_local;
  
  serializer.m_root._root = (xml_node_struct *)filename;
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x232,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib != (ModelCircuitLibrary *)0x0) {
    if (filename != (char *)0x0) {
      anon_unknown.dwarf_14aaaa::Serializer::Serializer((Serializer *)local_100,context);
      anon_unknown.dwarf_14aaaa::Serializer::serialize_library((Serializer *)local_100,lib);
      anon_unknown.dwarf_14aaaa::Serializer::dump_to_file
                ((Serializer *)local_100,(char *)serializer.m_root._root);
      anon_unknown.dwarf_14aaaa::Serializer::~Serializer((Serializer *)local_100);
      return true;
    }
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x234,
                  "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  __assert_fail("lib",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                ,0x233,
                "bool lsim::serialize_library(LSimContext *, ModelCircuitLibrary *, const char *)");
}

Assistant:

bool serialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Serializer serializer(context);
    serializer.serialize_library(lib);
    serializer.dump_to_file(filename);

    return true;
}